

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O0

void time_boost<boost::random::lagged_fibonacci_01_engine<double,48,3217u,576u>>
               (lagged_fibonacci_01_engine<double,_48,_3217U,_576U> *r,string *name)

{
  ulong uVar1;
  string *in_RSI;
  result_type_conflict1 rVar2;
  result_type_conflict1 res_plain;
  stringstream s;
  stringstream local_198 [16];
  ostream local_188 [40];
  lagged_fibonacci_01_engine<double,_48,_3217U,_576U> *in_stack_fffffffffffffea0;
  
  std::__cxx11::stringstream::stringstream(local_198);
  while( true ) {
    uVar1 = std::__cxx11::string::length();
    if (0x1f < uVar1) break;
    std::__cxx11::string::operator+=(in_RSI,' ');
  }
  std::operator<<((ostream *)&std::cout,in_RSI);
  rVar2 = time_plain<boost::random::lagged_fibonacci_01_engine<double,48,3217u,576u>>
                    (in_stack_fffffffffffffea0);
  std::ostream::operator<<(local_188,rVar2);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::__cxx11::stringstream::~stringstream(local_198);
  return;
}

Assistant:

void time_boost(R &r, std::string name) {
  std::stringstream s;  // write data to stream to prevent that code gets optimized away
  while (name.length() < 32)
    name += ' ';
  std::cout << name;
  const auto res_plain = time_plain(r);
  s << res_plain;
  std::cout << std::endl;
}